

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR ly_time_str2ts(char *value,timespec *ts)

{
  size_t sVar1;
  long lVar2;
  int local_5c;
  LY_ERR ret__;
  int frac_len;
  char frac_buf [10];
  char *fractions_s;
  LY_ERR rc;
  timespec *ts_local;
  char *value_local;
  
  if (value == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","value","ly_time_str2ts");
    value_local._4_4_ = LY_EINVAL;
  }
  else if (ts == (timespec *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ts","ly_time_str2ts");
    value_local._4_4_ = LY_EINVAL;
  }
  else {
    value_local._4_4_ = ly_time_str2time(value,&ts->tv_sec,(char **)(frac_buf + 2));
    if (value_local._4_4_ == LY_SUCCESS) {
      if (frac_buf._2_8_ == 0) {
        ts->tv_nsec = 0;
      }
      else {
        memset((byte *)((long)&ret__ + 2),0x30,9);
        frac_buf[1] = '\0';
        sVar1 = strlen((char *)frac_buf._2_8_);
        local_5c = (int)sVar1;
        if (9 < local_5c) {
          local_5c = 9;
        }
        memcpy((byte *)((long)&ret__ + 2),(void *)frac_buf._2_8_,(long)local_5c);
        lVar2 = atol((char *)((long)&ret__ + 2));
        ts->tv_nsec = lVar2;
        free((void *)frac_buf._2_8_);
      }
      value_local._4_4_ = LY_SUCCESS;
    }
  }
  return value_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_time_str2ts(const char *value, struct timespec *ts)
{
    LY_ERR rc;
    char *fractions_s, frac_buf[10];
    int frac_len;

    LY_CHECK_ARG_RET(NULL, value, ts, LY_EINVAL);

    rc = ly_time_str2time(value, &ts->tv_sec, &fractions_s);
    LY_CHECK_RET(rc);

    /* convert fractions of a second to nanoseconds */
    if (fractions_s) {
        /* init frac_buf with zeroes */
        memset(frac_buf, '0', 9);
        frac_buf[9] = '\0';

        frac_len = strlen(fractions_s);
        memcpy(frac_buf, fractions_s, frac_len > 9 ? 9 : frac_len);
        ts->tv_nsec = atol(frac_buf);
        free(fractions_s);
    } else {
        ts->tv_nsec = 0;
    }

    return LY_SUCCESS;
}